

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

Bool End_Profile(black_PWorker worker,Bool overshoot)

{
  PProfile_conflict pTVar1;
  long lVar2;
  PProfile_conflict oldProfile;
  Long h;
  Bool overshoot_local;
  black_PWorker worker_local;
  
  lVar2 = (long)worker->top - (long)worker->cProfile->offset >> 3;
  if (lVar2 < 0) {
    worker->error = 99;
    worker_local._7_1_ = '\x01';
  }
  else {
    if (0 < lVar2) {
      worker->cProfile->height = lVar2;
      if (overshoot != '\0') {
        if ((worker->cProfile->flags & 8) == 0) {
          worker->cProfile->flags = worker->cProfile->flags | 0x20;
        }
        else {
          worker->cProfile->flags = worker->cProfile->flags | 0x10;
        }
      }
      pTVar1 = worker->cProfile;
      worker->cProfile = (PProfile_conflict)worker->top;
      worker->top = worker->top + 8;
      worker->cProfile->height = 0;
      worker->cProfile->offset = worker->top;
      pTVar1->next = worker->cProfile;
      worker->num_Profs = worker->num_Profs + 1;
    }
    if (worker->top < worker->maxBuff) {
      worker->joint = '\0';
      worker_local._7_1_ = '\0';
    }
    else {
      worker->error = 0x62;
      worker_local._7_1_ = '\x01';
    }
  }
  return worker_local._7_1_;
}

Assistant:

static Bool
  End_Profile( RAS_ARGS Bool  overshoot )
  {
    Long  h;


    h = (Long)( ras.top - ras.cProfile->offset );

    if ( h < 0 )
    {
      FT_ERROR(( "End_Profile: negative height encountered\n" ));
      ras.error = FT_THROW( Raster_Negative_Height );
      return FAILURE;
    }

    if ( h > 0 )
    {
      PProfile  oldProfile;


      FT_TRACE6(( "  ending profile %p, start = %ld, height = %ld\n",
                  (void *)ras.cProfile, ras.cProfile->start, h ));

      ras.cProfile->height = h;
      if ( overshoot )
      {
        if ( ras.cProfile->flags & Flow_Up )
          ras.cProfile->flags |= Overshoot_Top;
        else
          ras.cProfile->flags |= Overshoot_Bottom;
      }

      oldProfile   = ras.cProfile;
      ras.cProfile = (PProfile)ras.top;

      ras.top += AlignProfileSize;

      ras.cProfile->height = 0;
      ras.cProfile->offset = ras.top;

      oldProfile->next = ras.cProfile;
      ras.num_Profs++;
    }

    if ( ras.top >= ras.maxBuff )
    {
      FT_TRACE1(( "overflow in End_Profile\n" ));
      ras.error = FT_THROW( Raster_Overflow );
      return FAILURE;
    }

    ras.joint = FALSE;

    return SUCCESS;
  }